

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  pointer puVar1;
  pointer puVar2;
  ElementSegment *segment_00;
  bool bVar3;
  HeapType type;
  ulong uVar4;
  pointer puVar5;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  pointer puVar6;
  undefined1 local_60 [8];
  Literal null;
  TableInterfaceInfo info;
  
  puVar5 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      bVar3 = wasm::Type::isNullable
                        (&((puVar5->_M_t).
                           super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                           super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
      if (bVar3) {
        getTableInterfaceInfo
                  ((TableInterfaceInfo *)&null.type,this,
                   (IString)*(IString *)
                             &(((puVar5->_M_t).
                                super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                              super_Importable).super_Named);
        type = wasm::Type::getHeapType
                         (&((puVar5->_M_t).
                            super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                            .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type);
        Literal::makeNull((Literal *)local_60,type);
        if ((((puVar5->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
              super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial).addr != 0) {
          uVar4 = 0;
          do {
            (**(code **)(*(long *)null.type.id + 0xe0))
                      (null.type.id,info.interface,info.name.super_IString.str._M_len,
                       uVar4 & 0xffffffff,(Literal *)local_60);
            uVar4 = uVar4 + 1;
          } while (uVar4 < (((puVar5->_M_t).
                             super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                             .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial).
                           addr);
        }
        Literal::~Literal((Literal *)local_60);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  puVar6 = (this->wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar2) {
    null.type.id = (uintptr_t)this;
    do {
      segment_00 = (puVar6->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(char **)((long)&(segment_00->table).super_IString + 8) != (char *)0x0) {
        initializeTableContents::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)&null.type,segment_00);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  return;
}

Assistant:

void initializeTableContents() {
    for (auto& table : wasm.tables) {
      if (table->type.isNullable()) {
        // Initial with nulls in a nullable table.
        auto info = getTableInterfaceInfo(table->name);
        auto null = Literal::makeNull(table->type.getHeapType());
        for (Address i = 0; i < table->initial; i++) {
          info.interface->tableStore(info.name, i, null);
        }
      }
    }

    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      Address offset =
        (uint32_t)self()->visit(segment->offset).getSingleValue().geti32();

      Table* table = wasm.getTable(segment->table);
      ExternalInterface* extInterface = externalInterface;
      Name tableName = segment->table;
      if (table->imported()) {
        auto inst = linkedInstances.at(table->module);
        extInterface = inst->externalInterface;
        tableName = inst->wasm.getExport(table->base)->value;
      }

      for (Index i = 0; i < segment->data.size(); ++i) {
        Flow ret = self()->visit(segment->data[i]);
        extInterface->tableStore(tableName, offset + i, ret.getSingleValue());
      }
    });
  }